

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O3

void train(svm_params *params)

{
  _Rb_tree_header *p_Var1;
  svm_example *psVar2;
  svm_model *model;
  vw *pvVar3;
  svm_model *psVar4;
  svm_example **ppsVar5;
  svm_example *this;
  char cVar6;
  bool bVar7;
  uint uVar8;
  _Self __tmp;
  bool *train_pool;
  ulong uVar9;
  float *scores;
  _Base_ptr p_Var10;
  double *subopt;
  ulong uVar11;
  long *plVar12;
  size_t sVar13;
  float *pfVar14;
  long lVar15;
  vw_ostream *pvVar16;
  ulong uVar17;
  ulong uVar18;
  size_t sVar19;
  float fVar20;
  float fVar21;
  multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
  scoremap;
  pair<const_double,_const_unsigned_long> local_70;
  _Rb_tree<double,_std::pair<const_double,_unsigned_long>,_std::_Select1st<std::pair<const_double,_unsigned_long>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
  local_60;
  
  train_pool = calloc_or_throw<bool>(params->pool_size);
  if (params->pool_size != 0) {
    uVar9 = 0;
    do {
      train_pool[uVar9] = false;
      uVar9 = uVar9 + 1;
    } while (uVar9 < params->pool_size);
  }
  scores = calloc_or_throw<float>(params->pool_pos);
  predict(params,params->pool,scores,params->pool_pos);
  if (params->active != false) {
    if (params->active_pool_greedy == false) {
      if (params->pool_pos != 0) {
        uVar9 = 0;
        do {
          sVar19 = (params->pool[uVar9]->ex).example_counter;
          fVar20 = expf((float)SQRT(((double)CONCAT44(0x45300000,(int)(sVar19 >> 0x20)) -
                                    1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)sVar19) - 4503599627370496.0))
                        * (float)((double)ABS(scores[uVar9]) * params->active_c));
          fVar21 = 2.0 / (fVar20 + 1.0);
          fVar20 = merand48(&params->all->random_state);
          if (fVar20 < fVar21) {
            (params->pool[uVar9]->ex).l.simple.weight =
                 (1.0 / fVar21) * (params->pool[uVar9]->ex).l.simple.weight;
            train_pool[uVar9] = true;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < params->pool_pos);
      }
    }
    else {
      p_Var1 = &local_60._M_impl.super__Rb_tree_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      if (params->pool_pos != 0) {
        uVar9 = 0;
        do {
          local_70.first = (double)ABS(scores[uVar9]);
          local_70.second = uVar9;
          std::
          _Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
          ::_M_emplace_equal<std::pair<double_const,unsigned_long_const>>
                    ((_Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                      *)&local_60,&local_70);
          uVar9 = uVar9 + 1;
        } while (uVar9 < params->pool_pos);
        if (((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1)
           && (params->subsample != 0)) {
          p_Var10 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          uVar9 = 2;
          do {
            train_pool[(long)p_Var10[1]._M_parent] = true;
            p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
            if ((_Rb_tree_header *)p_Var10 == p_Var1) break;
            bVar7 = uVar9 <= params->subsample;
            uVar9 = uVar9 + 1;
          } while (bVar7);
        }
      }
      std::
      _Rb_tree<double,_std::pair<const_double,_unsigned_long>,_std::_Select1st<std::pair<const_double,_unsigned_long>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
      ::~_Rb_tree(&local_60);
    }
  }
  if (params->para_active == true) {
    uVar9 = params->pool_pos;
    if (uVar9 != 0) {
      uVar18 = 0;
      do {
        if (train_pool[uVar18] == false) {
          psVar2 = params->pool[uVar18];
          if (psVar2 != (svm_example *)0x0) {
            svm_example::~svm_example(psVar2);
          }
          operator_delete(psVar2);
          uVar9 = params->pool_pos;
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 < uVar9);
    }
    sync_queries(params->all,params,train_pool);
  }
  if (params->all->training == false) {
    if (params->pool_pos != 0) {
      uVar9 = 0;
      do {
        psVar2 = params->pool[uVar9];
        if (psVar2 != (svm_example *)0x0) {
          svm_example::~svm_example(psVar2);
        }
        operator_delete(psVar2);
        uVar9 = uVar9 + 1;
      } while (uVar9 < params->pool_pos);
    }
  }
  else if (params->pool_pos != 0) {
    model = params->model;
    uVar9 = 0;
    do {
      if (((params->active != true) || (train_pool[uVar9] == true)) &&
         (uVar8 = add(params,params->pool[uVar9]), -1 < (int)uVar8)) {
        bVar7 = update(params,(ulong)uVar8);
        subopt = calloc_or_throw<double>(model->num_support);
        if (params->reprocess != 0) {
          uVar18 = 0;
          do {
            if (model->num_support == 0) break;
            fVar20 = merand48(&params->all->random_state);
            if (0.5 <= fVar20) {
              sVar19 = suboptimality(model,subopt);
              if (0.0 < subopt[sVar19]) {
                if (((!bVar7) && (uVar18 == 0)) && ((sVar19 == uVar8 && (sVar19 != 0)))) {
                  pvVar3 = params->all;
                  pvVar16 = &pvVar3->trace_message;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (&pvVar16->super_ostream,"Shouldn\'t reprocess right after process!!!",
                             0x2a);
                  cVar6 = (char)pvVar16;
                  std::ios::widen((char)(pvVar3->trace_message).super_ostream._vptr_basic_ostream
                                        [-3] + cVar6);
                  std::ostream::put(cVar6);
                  std::ostream::flush();
                }
                uVar11 = model->num_support * sVar19;
                if (uVar11 < params->maxcache || uVar11 - params->maxcache == 0) {
                  psVar4 = params->model;
                  uVar11 = psVar4->num_support;
                  if (uVar11 <= sVar19) {
                    pvVar16 = &params->all->trace_message;
                    std::__ostream_insert<char,std::char_traits<char>>
                              (&pvVar16->super_ostream,"Internal error at ",0x12);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (&pvVar16->super_ostream,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/kernel_svm.cc"
                               ,0x69);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (&pvVar16->super_ostream,":",1);
                    plVar12 = (long *)std::ostream::operator<<(pvVar16,0x99);
                    std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
                    std::ostream::put((char)plVar12);
                    std::ostream::flush();
                  }
                  psVar2 = (psVar4->support_vec)._begin[sVar19];
                  svm_example::compute_kernels(psVar2,params);
                  fVar20 = (psVar4->alpha)._begin[sVar19];
                  fVar21 = (psVar4->delta)._begin[sVar19];
                  for (sVar13 = sVar19; sVar13 != 0; sVar13 = sVar13 - 1) {
                    ppsVar5 = (psVar4->support_vec)._begin;
                    ppsVar5[sVar13] = ppsVar5[sVar13 - 1];
                    pfVar14 = (psVar4->alpha)._begin;
                    pfVar14[sVar13] = pfVar14[sVar13 - 1];
                    pfVar14 = (psVar4->delta)._begin;
                    pfVar14[sVar13] = pfVar14[sVar13 - 1];
                  }
                  *(psVar4->support_vec)._begin = psVar2;
                  *(psVar4->alpha)._begin = fVar20;
                  *(psVar4->delta)._begin = fVar21;
                  if (uVar11 != 0) {
                    uVar17 = 0;
                    do {
                      this = (psVar4->support_vec)._begin[uVar17];
                      pfVar14 = (this->krow)._begin;
                      if (sVar19 < (ulong)((long)(this->krow)._end - (long)pfVar14 >> 2)) {
                        fVar20 = pfVar14[sVar19];
                        sVar13 = sVar19;
                        if (sVar19 != 0) {
                          do {
                            pfVar14 = (this->krow)._begin;
                            pfVar14[sVar13] = pfVar14[sVar13 - 1];
                            sVar13 = sVar13 - 1;
                          } while (sVar13 != 0);
                          pfVar14 = (this->krow)._begin;
                        }
                        *pfVar14 = fVar20;
                      }
                      else {
                        fVar20 = (psVar2->krow)._begin[uVar17];
                        local_60._M_impl._0_4_ = 0;
                        v_array<float>::push_back(&this->krow,(float *)&local_60);
                        pfVar14 = (this->krow)._begin;
                        lVar15 = ((long)(this->krow)._end - (long)pfVar14 >> 2) + -1;
                        if (lVar15 != 0) {
                          do {
                            pfVar14 = (this->krow)._begin;
                            pfVar14[lVar15] = pfVar14[lVar15 + -1];
                            lVar15 = lVar15 + -1;
                          } while (lVar15 != 0);
                          pfVar14 = (this->krow)._begin;
                        }
                        *pfVar14 = fVar20;
                      }
                      uVar17 = uVar17 + 1;
                    } while (uVar17 != uVar11);
                  }
                }
                goto LAB_00201dea;
              }
            }
            else {
              fVar20 = merand48(&params->all->random_state);
              fVar20 = floorf(fVar20 * (float)model->num_support);
              sVar19 = (long)(fVar20 - 9.223372e+18) & (long)fVar20 >> 0x3f | (long)fVar20;
LAB_00201dea:
              update(params,sVar19);
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 < params->reprocess);
        }
        free(subopt);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < params->pool_pos);
  }
  free(scores);
  free(train_pool);
  return;
}

Assistant:

void train(svm_params& params)
{
  // params.all->opts_n_args.trace_message<<"In train "<<params.all->training<<endl;

  bool* train_pool = calloc_or_throw<bool>(params.pool_size);
  for (size_t i = 0; i < params.pool_size; i++) train_pool[i] = false;

  float* scores = calloc_or_throw<float>(params.pool_pos);
  predict(params, params.pool, scores, params.pool_pos);
  // cout<<scores[0]<<endl;

  if (params.active)
  {
    if (params.active_pool_greedy)
    {
      multimap<double, size_t> scoremap;
      for (size_t i = 0; i < params.pool_pos; i++)
        scoremap.insert(pair<const double, const size_t>(fabs(scores[i]), i));

      multimap<double, size_t>::iterator iter = scoremap.begin();
      // params.all->opts_n_args.trace_message<<params.pool_size<<" "<<"Scoremap: ";
      // for(;iter != scoremap.end();iter++)
      // params.all->opts_n_args.trace_message<<iter->first<<" "<<iter->second<<"
      // "<<((label_data*)params.pool[iter->second]->ld)->label<<"\t"; params.all->opts_n_args.trace_message<<endl;
      iter = scoremap.begin();

      for (size_t train_size = 1; iter != scoremap.end() && train_size <= params.subsample; train_size++)
      {
        // params.all->opts_n_args.trace_message<<train_size<<" "<<iter->second<<" "<<iter->first<<endl;
        train_pool[iter->second] = 1;
        iter++;
      }
    }
    else
    {
      for (size_t i = 0; i < params.pool_pos; i++)
      {
        float queryp = 2.0f /
            (1.0f +
                expf(
                    (float)(params.active_c * fabs(scores[i])) * (float)pow(params.pool[i]->ex.example_counter, 0.5f)));
        if (merand48(params.all->random_state) < queryp)
        {
          svm_example* fec = params.pool[i];
          fec->ex.l.simple.weight *= 1 / queryp;
          train_pool[i] = 1;
        }
      }
    }
    // free(scores);
  }

  if (params.para_active)
  {
    for (size_t i = 0; i < params.pool_pos; i++)
      if (!train_pool[i])
        delete params.pool[i];
    sync_queries(*(params.all), params, train_pool);
  }

  if (params.all->training)
  {
    svm_model* model = params.model;

    for (size_t i = 0; i < params.pool_pos; i++)
    {
      // params.all->opts_n_args.trace_message<<"process: "<<i<<" "<<train_pool[i]<<endl;;
      int model_pos = -1;
      if (params.active)
      {
        if (train_pool[i])
        {
          // params.all->opts_n_args.trace_message<<"i = "<<i<<"train_pool[i] = "<<train_pool[i]<<"
          // "<<params.pool[i]->example_counter<<endl;
          model_pos = add(params, params.pool[i]);
        }
      }
      else
        model_pos = add(params, params.pool[i]);

      // params.all->opts_n_args.trace_message<<"Added: "<<model_pos<<"
      // "<<model->support_vec[model_pos]->example_counter<<endl; cout<<"After adding in train
      // "<<model->num_support<<endl;

      if (model_pos >= 0)
      {
        bool overshoot = update(params, model_pos);
        // cout<<model_pos<<":alpha = "<<model->alpha[model_pos]<<endl;

        double* subopt = calloc_or_throw<double>(model->num_support);
        for (size_t j = 0; j < params.reprocess; j++)
        {
          if (model->num_support == 0)
            break;
          // cout<<"reprocess: ";
          int randi = 1;
          if (merand48(params.all->random_state) < 0.5)
            randi = 0;
          if (randi)
          {
            size_t max_pos = suboptimality(model, subopt);
            if (subopt[max_pos] > 0)
            {
              if (!overshoot && max_pos == (size_t)model_pos && max_pos > 0 && j == 0)
                params.all->trace_message << "Shouldn't reprocess right after process!!!" << endl;
              // cout<<max_pos<<" "<<subopt[max_pos]<<endl;
              // cout<<params.model->support_vec[0]->example_counter<<endl;
              if (max_pos * model->num_support <= params.maxcache)
                make_hot_sv(params, max_pos);
              update(params, max_pos);
            }
          }
          else
          {
            size_t rand_pos = (size_t)floorf(merand48(params.all->random_state) * model->num_support);
            update(params, rand_pos);
          }
        }
        // cout<<endl;
        // cout<<params.model->support_vec[0]->example_counter<<endl;
        free(subopt);
      }
    }
  }
  else
    for (size_t i = 0; i < params.pool_pos; i++) delete params.pool[i];

  // params.all->opts_n_args.trace_message<<params.model->support_vec[0]->example_counter<<endl;
  // for(int i = 0;i < params.pool_size;i++)
  //   params.all->opts_n_args.trace_message<<scores[i]<<" ";
  // params.all->opts_n_args.trace_message<<endl;
  free(scores);
  // params.all->opts_n_args.trace_message<<params.model->support_vec[0]->example_counter<<endl;
  free(train_pool);
  // params.all->opts_n_args.trace_message<<params.model->support_vec[0]->example_counter<<endl;
}